

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_zero_lattice_digital_filter.cc
# Opt level: O1

bool __thiscall
sptk::AllZeroLatticeDigitalFilter::Run
          (AllZeroLatticeDigitalFilter *this,
          vector<double,_std::allocator<double>_> *filter_coefficients,double filter_input,
          double *filter_output,Buffer *buffer)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  double *pdVar6;
  bool bVar7;
  size_type __new_size;
  ulong uVar8;
  double dVar9;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar7 = false;
  if (((buffer != (Buffer *)0x0) && (bVar7 = false, filter_output != (double *)0x0)) &&
     (__new_size = (size_type)this->num_filter_order_, bVar7 = false,
     (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish -
     (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start >> 3 == __new_size + 1)) {
    if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,__new_size);
      pdVar4 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar4 != pdVar5) {
        memset(pdVar4,0,((long)pdVar5 + (-8 - (long)pdVar4) & 0xfffffffffffffff8U) + 8);
      }
    }
    uVar3 = this->num_filter_order_;
    pdVar6 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)uVar3 == 0) {
      dVar9 = filter_input * *pdVar6;
    }
    else {
      if (0 < (int)uVar3) {
        pdVar4 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = 0;
        dVar9 = filter_input;
        do {
          dVar1 = pdVar4[uVar8];
          dVar2 = pdVar6[uVar8 + 1];
          pdVar4[uVar8] = dVar9;
          dVar9 = dVar2 * filter_input + dVar1;
          filter_input = dVar2 * dVar1 + filter_input;
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
      dVar9 = filter_input * *pdVar6;
    }
    *filter_output = dVar9;
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool AllZeroLatticeDigitalFilter::Run(
    const std::vector<double>& filter_coefficients, double filter_input,
    double* filter_output, AllZeroLatticeDigitalFilter::Buffer* buffer) const {
  // Check inputs
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d_.size() != static_cast<std::size_t>(num_filter_order_)) {
    buffer->d_.resize(num_filter_order_);
    std::fill(buffer->d_.begin(), buffer->d_.end(), 0.0);
  }

  if (0 == num_filter_order_) {
    *filter_output = filter_input * filter_coefficients[0];
    return true;
  }

  const double* k(&(filter_coefficients[1]));
  double* d(&buffer->d_[0]);
  double sum(filter_input);
  double next_d(filter_input);

  // Apply all-zero lattice filter.
  for (int m(0); m < num_filter_order_; ++m) {
    const double tmp(d[m] + k[m] * sum);
    sum += k[m] * d[m];
    d[m] = next_d;
    next_d = tmp;
  }

  // Save result.
  *filter_output = sum * filter_coefficients[0];

  return true;
}